

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::hex_writer::operator()
          (hex_writer *this,ostream_iterator<char,_char,_std::char_traits<char>_> *it)

{
  ostream_iterator<char,_char,_std::char_traits<char>_> *in_RSI;
  bool in_stack_0000001b;
  int in_stack_0000001c;
  unsigned_long in_stack_00000020;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_30;
  ostream_type *local_20;
  char *local_18;
  ostream_iterator<char,_char,_std::char_traits<char>_> *local_10;
  
  local_10 = in_RSI;
  std::ostream_iterator<char,_char,_std::char_traits<char>_>::ostream_iterator(&local_30,in_RSI);
  internal::
  format_uint<4u,char,std::ostream_iterator<char,char,std::char_traits<char>>,unsigned_long>
            (it,in_stack_00000020,in_stack_0000001c,in_stack_0000001b);
  local_10->_M_stream = local_20;
  local_10->_M_string = local_18;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<4, char_type>(
              it, self.abs_value, num_digits, self.spec.type != 'x');
      }